

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O0

Code * __thiscall r_exec::HLPBindingMap::bind_pattern(HLPBindingMap *this,Code *pattern)

{
  bool bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  _Mem *p_Var8;
  undefined4 extraout_var;
  HLPBindingMap *pHVar9;
  undefined4 extraout_var_00;
  Code *pCVar10;
  undefined4 extraout_var_01;
  const_reference this_00;
  Value *pVVar11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined8 uVar12;
  ushort local_54;
  undefined4 local_50;
  uint16_t j;
  uint16_t atom_count;
  Atom p_atom;
  uint16_t i_1;
  uint16_t extent_index;
  Code *reference;
  uint16_t i;
  undefined4 local_2c;
  HLPBindingMap *local_28;
  Code *bound_pattern;
  Code *pattern_local;
  HLPBindingMap *this_local;
  
  bound_pattern = pattern;
  pattern_local = (Code *)this;
  bVar1 = need_binding(this,pattern);
  if (bVar1) {
    p_Var8 = _Mem::Get();
    iVar4 = (*(bound_pattern->super__Object)._vptr__Object[4])(bound_pattern,0);
    local_2c = *(undefined4 *)CONCAT44(extraout_var,iVar4);
    pHVar9 = (HLPBindingMap *)(**(code **)(*(long *)p_Var8 + 0x50))(p_Var8,&local_2c);
    r_code::Atom::~Atom((Atom *)&local_2c);
    reference._2_2_ = 0;
    local_28 = pHVar9;
    while( true ) {
      uVar5 = (*(bound_pattern->super__Object)._vptr__Object[10])();
      if ((uVar5 & 0xffff) <= (uint)reference._2_2_) break;
      uVar12 = 0;
      iVar4 = (*(bound_pattern->super__Object)._vptr__Object[9])
                        (bound_pattern,(ulong)reference._2_2_);
      _p_atom = (Code *)CONCAT44(extraout_var_00,iVar4);
      bVar1 = need_binding(this,_p_atom);
      pHVar9 = local_28;
      if (bVar1) {
        pCVar10 = bind_pattern(this,_p_atom);
        (*(pHVar9->super_BindingMap).super__Object._vptr__Object[8])
                  (pHVar9,(ulong)reference._2_2_,pCVar10,
                   CONCAT62((int6)((ulong)uVar12 >> 0x10),reference._2_2_));
      }
      else {
        (*(local_28->super_BindingMap).super__Object._vptr__Object[8])
                  (local_28,(ulong)reference._2_2_,_p_atom,
                   CONCAT62((int6)((ulong)uVar12 >> 0x10),reference._2_2_));
      }
      reference._2_2_ = reference._2_2_ + 1;
    }
    iVar4 = (*(bound_pattern->super__Object)._vptr__Object[6])();
    atom_count = (uint16_t)iVar4;
    j = 1;
    while( true ) {
      uVar5 = (uint)j;
      uVar6 = (*(bound_pattern->super__Object)._vptr__Object[6])();
      if ((uVar6 & 0xffff) <= uVar5) break;
      iVar4 = (*(bound_pattern->super__Object)._vptr__Object[4])(bound_pattern,(ulong)j);
      local_50 = *(undefined4 *)CONCAT44(extraout_var_01,iVar4);
      bVar2 = r_code::Atom::getDescriptor();
      if (bVar2 == 0x86) {
        uVar3 = r_code::Atom::asIndex();
        this_00 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::
                  operator[](&(this->super_BindingMap).map,(ulong)uVar3);
        pVVar11 = core::P<r_exec::Value>::operator->(this_00);
        (*(pVVar11->super__Object)._vptr__Object[3])(pVVar11,local_28,(ulong)j,&atom_count);
      }
      else if (bVar2 - 0xc6 < 2) {
        iVar4 = (*(local_28->super_BindingMap).super__Object._vptr__Object[4])(local_28,(ulong)j);
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar4),(Atom *)&local_50);
        bVar2 = r_code::Atom::getAtomCount();
        local_54 = j;
        while( true ) {
          local_54 = local_54 + 1;
          if ((uint)j + (uint)(ushort)bVar2 < (uint)local_54) break;
          iVar4 = (*(bound_pattern->super__Object)._vptr__Object[4])(bound_pattern,(ulong)local_54);
          iVar7 = (*(local_28->super_BindingMap).super__Object._vptr__Object[4])
                            (local_28,(ulong)local_54);
          r_code::Atom::operator=
                    ((Atom *)CONCAT44(extraout_var_04,iVar7),(Atom *)CONCAT44(extraout_var_03,iVar4)
                    );
        }
        j = j + bVar2;
      }
      else {
        iVar4 = (*(local_28->super_BindingMap).super__Object._vptr__Object[4])(local_28,(ulong)j);
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar4),(Atom *)&local_50);
      }
      r_code::Atom::~Atom((Atom *)&local_50);
      j = j + 1;
    }
    this_local = local_28;
  }
  else {
    this_local = (HLPBindingMap *)bound_pattern;
  }
  return (Code *)this_local;
}

Assistant:

Code *HLPBindingMap::bind_pattern(Code *pattern) const
{
    if (!need_binding(pattern)) {
        return pattern;
    }

    Code *bound_pattern = _Mem::Get()->build_object(pattern->code(0));

    for (uint16_t i = 0; i < pattern->references_size(); ++i) { // bind references when needed; must be done before binding the code as this may add references.
        Code *reference = pattern->get_reference(i);

        if (need_binding(reference)) {
            bound_pattern->set_reference(i, bind_pattern(reference));
        } else {
            bound_pattern->set_reference(i, reference);
        }
    }

    uint16_t extent_index = pattern->code_size();

    for (uint16_t i = 1; i < pattern->code_size(); ++i) { // transform code containing variables into actual values when they exist: objects -> r_ptr, structures -> i_ptr, atoms -> atoms.
        Atom p_atom = pattern->code(i);

        switch (p_atom.getDescriptor()) {
        case Atom::VL_PTR:
            map[p_atom.asIndex()]->valuate(bound_pattern, i, extent_index);
            break;

        case Atom::TIMESTAMP:
        case Atom::STRING: { // avoid misinterpreting raw data that could be lead by descriptors.
            bound_pattern->code(i) = p_atom;
            uint16_t atom_count = p_atom.getAtomCount();

            for (uint16_t j = i + 1; j <= i + atom_count; ++j) {
                bound_pattern->code(j) = pattern->code(j);
            }

            i += atom_count;
            break;
        }

        default:
            bound_pattern->code(i) = p_atom;
            break;
        }
    }

    return bound_pattern;
}